

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void * __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::Ptr(GraphCycles *this,GraphId id)

{
  Node *pNVar1;
  void *local_30;
  Node *n;
  GraphCycles *this_local;
  GraphId id_local;
  
  pNVar1 = FindNode(this->rep_,id);
  if (pNVar1 == (Node *)0x0) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = base_internal::UnhidePtr<void>(pNVar1->masked_ptr);
  }
  return local_30;
}

Assistant:

void* GraphCycles::Ptr(GraphId id) {
  Node* n = FindNode(rep_, id);
  return n == nullptr ? nullptr
                      : base_internal::UnhidePtr<void>(n->masked_ptr);
}